

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O1

mecab_node_t * __thiscall MeCab::FreeList<mecab_node_t>::alloc(FreeList<mecab_node_t> *this)

{
  pointer *pppmVar1;
  iterator __position;
  size_t sVar2;
  mecab_node_t *pmVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  mecab_node_t *local_18;
  
  if (this->pi_ == this->size) {
    this->li_ = this->li_ + 1;
    this->pi_ = 0;
  }
  __position._M_current =
       (this->freeList).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (this->li_ ==
      (long)__position._M_current -
      (long)(this->freeList).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = this->size;
    uVar5 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x70),8) == 0) {
      uVar5 = SUB168(auVar4 * ZEXT816(0x70),0);
    }
    local_18 = (mecab_node_t *)operator_new__(uVar5);
    if (__position._M_current ==
        (this->freeList).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<mecab_node_t*,std::allocator<mecab_node_t*>>::_M_realloc_insert<mecab_node_t*>
                ((vector<mecab_node_t*,std::allocator<mecab_node_t*>> *)&this->freeList,__position,
                 &local_18);
    }
    else {
      *__position._M_current = local_18;
      pppmVar1 = &(this->freeList).
                  super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppmVar1 = *pppmVar1 + 1;
    }
  }
  sVar2 = this->pi_;
  pmVar3 = (this->freeList).super__Vector_base<mecab_node_t_*,_std::allocator<mecab_node_t_*>_>.
           _M_impl.super__Vector_impl_data._M_start[this->li_];
  this->pi_ = sVar2 + 1;
  return pmVar3 + sVar2;
}

Assistant:

T* alloc() {
    if (pi_ == size) {
      li_++;
      pi_ = 0;
    }
    if (li_ == freeList.size()) freeList.push_back(new T[size]);
    return freeList[li_] + (pi_++);
  }